

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio.c
# Opt level: O2

void apu_push_sample(gba_apu_t *apu)

{
  uint64_t uVar1;
  float fVar2;
  float fVar3;
  
  uVar1 = (apu->bigbuffer).write_index;
  if (uVar1 - (apu->bigbuffer).read_index < 0x1000) {
    fVar2 = (float)(int)(char)apu->fifo[0].sample + 127.0;
    fVar3 = (float)(int)(char)apu->fifo[1].sample + 127.0;
    (apu->bigbuffer).write_index = uVar1 + 1;
    (apu->bigbuffer).buf[(uint)uVar1 & 0xfff] =
         ((fVar3 + fVar3) / 255.0 + -1.0 + (fVar2 + fVar2) / 255.0 + -1.0) * 0.5;
  }
  return;
}

Assistant:

void apu_push_sample(gba_apu_t* apu) {
    uint64_t size = apu->bigbuffer.write_index - apu->bigbuffer.read_index;
    if (size < AUDIO_BIGBUFFER_SIZE) {
        float sample = mix(apu);
        apu->bigbuffer.buf[(apu->bigbuffer.write_index++) % AUDIO_BIGBUFFER_SIZE] = sample;
    }
}